

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::InstancedGridRenderTest::iterate
          (InstancedGridRenderTest *this)

{
  pointer this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  deUint32 err;
  RenderTarget *pRVar6;
  ShaderProgramDeclaration *pSVar7;
  int iVar8;
  int iVar9;
  size_t __n;
  Surface *pSVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int y;
  int iVar11;
  VertexAttribute *__x;
  undefined4 uVar12;
  char *description;
  int x;
  bool bVar13;
  bool bVar14;
  float fVar15;
  allocator<char> local_699;
  allocator<char> local_698;
  allocator<char> local_697;
  allocator<char> local_696;
  allocator<char> local_695;
  float local_694;
  Surface surface;
  FragmentOutput local_65c;
  deUint32 indexBuf;
  void *local_650;
  deUint16 indices [6];
  undefined1 local_618 [32];
  deUint32 colorBuf;
  deUint32 offsetBuf;
  deUint32 positionBuf;
  undefined1 local_598 [8];
  pointer pVStack_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  GenericVecType local_578;
  VertexAttribute local_558;
  VertexToFragmentVarying local_530;
  string local_528 [32];
  GLContext ctx;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> offsets;
  undefined1 local_308 [8];
  undefined8 uStack_300;
  undefined1 local_2f8 [20];
  float local_2e4;
  pointer local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  float local_2c8;
  undefined8 local_2c4;
  int local_2bc;
  float local_2b8;
  float local_2b4;
  pointer local_2b0;
  GridProgram program;
  
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar9 = pRVar6->m_width;
  if (0x3ff < iVar9) {
    iVar9 = 0x400;
  }
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = 0x400;
  if (pRVar6->m_height < 0x400) {
    iVar8 = pRVar6->m_height;
  }
  local_308 = (undefined1  [8])0x0;
  uStack_300 = (pointer)CONCAT44(iVar8,iVar9);
  sglr::GLContext::GLContext
            (&ctx,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)local_308);
  tcu::Surface::Surface(&surface,iVar9,iVar8);
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_308);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_618,"a_position",&local_697);
  std::__cxx11::string::string((string *)&offsets,(string *)local_618);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<
                     ((ShaderProgramDeclaration *)local_308,(VertexAttribute *)&offsets);
  std::__cxx11::string::string<std::allocator<char>>((string *)indices,"a_offset",&local_698);
  std::__cxx11::string::string((string *)local_598,(string *)indices);
  local_578 = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,(VertexAttribute *)local_598);
  std::__cxx11::string::string<std::allocator<char>>((string *)&positionBuf,"a_color",&local_699);
  std::__cxx11::string::string((string *)&local_558,(string *)&positionBuf);
  local_558.type = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_558);
  local_530.type = GENERICVECTYPE_FLOAT;
  local_530.flatshade = false;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_530);
  local_65c.type = GENERICVECTYPE_FLOAT;
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,&local_65c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorBuf,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_offset;\nin highp vec4 a_color;\nout mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = a_position + a_offset;\n\tv_color = a_color;\n}\n"
             ,&local_695);
  std::__cxx11::string::string((string *)&offsetBuf,(string *)&colorBuf);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,(VertexSource *)&offsetBuf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_528,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\nvoid main(void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,&local_696);
  std::__cxx11::string::string((string *)&indexBuf,local_528);
  pSVar7 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar7,(FragmentSource *)&indexBuf);
  sglr::ShaderProgram::ShaderProgram(&program.super_ShaderProgram,pSVar7);
  std::__cxx11::string::~string((string *)&indexBuf);
  std::__cxx11::string::~string(local_528);
  std::__cxx11::string::~string((string *)&offsetBuf);
  std::__cxx11::string::~string((string *)&colorBuf);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&positionBuf);
  std::__cxx11::string::~string((string *)local_598);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&offsets);
  std::__cxx11::string::~string((string *)local_618);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_308);
  program.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e39920;
  program.super_ShaderProgram.super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e39958;
  positionBuf = 0;
  program.super_ShaderProgram.super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e39970;
  offsetBuf = 0;
  colorBuf = 0;
  local_558.name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_558.name._M_string_length = 0x3f80000000000000;
  indexBuf = 0;
  local_618._0_4_ = 0x3f800000;
  local_618._4_4_ = 0x3f800000;
  local_618._8_4_ = 0;
  local_618._12_4_ = 0x3f800000;
  uVar2 = (*ctx.super_Context._vptr_Context[0x75])();
  uVar3 = (*ctx.super_Context._vptr_Context[0x59])(&ctx,(ulong)uVar2,"a_position");
  uVar4 = (*ctx.super_Context._vptr_Context[0x59])(&ctx,(ulong)uVar2,"a_offset");
  uVar5 = (*ctx.super_Context._vptr_Context[0x59])(&ctx,(ulong)uVar2,"a_color");
  iVar9 = this->m_gridSide;
  local_694 = 2.0 / (float)iVar9;
  local_308 = (undefined1  [8])0x0;
  uStack_300 = (pointer)0x3f80000000000000;
  local_2f8._4_8_ = 0;
  local_2f8._12_8_ = 0x3f800000;
  local_2e0 = (pointer)0x3f80000000000000;
  local_2d8._M_allocated_capacity._0_4_ = 0;
  local_2d8._8_8_ = (pointer)0x3f80000000000000;
  local_2c4._0_4_ = SNORM_INT8;
  local_2c4._4_4_ = 0;
  local_2bc = 0x3f800000;
  local_2b0 = (pointer)0x3f80000000000000;
  indices[0] = 0;
  indices[1] = 4;
  indices[2] = 3;
  indices[3] = 2;
  indices[4] = 1;
  indices[5] = 5;
  offsets.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offsets.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  offsets.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._0_4_ = local_694;
  local_2e4 = local_694;
  local_2d8._M_allocated_capacity._4_4_ = local_694;
  local_2c8 = local_694;
  local_2b8 = local_694;
  local_2b4 = local_694;
  for (iVar8 = 0; iVar8 < iVar9; iVar8 = iVar8 + 1) {
    fVar15 = (float)iVar8 * local_694;
    for (iVar11 = 0; iVar11 < iVar9; iVar11 = iVar11 + 1) {
      local_598._4_4_ = (float)iVar11 * local_694 + -1.0;
      local_598._0_4_ = fVar15 + -1.0;
      pVStack_590 = (pointer)0x0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&offsets,
                 (Vector<float,_4> *)local_598);
      iVar9 = this->m_gridSide;
    }
  }
  local_598 = (undefined1  [8])0x0;
  pVStack_590 = (pointer)0x0;
  local_588._M_allocated_capacity = 0;
  for (iVar8 = 0; iVar8 < iVar9; iVar8 = iVar8 + 1) {
    for (iVar11 = 0; iVar11 < iVar9; iVar11 = iVar11 + 1) {
      __x = (VertexAttribute *)local_618;
      if ((iVar8 + iVar11 & 1U) == 0) {
        __x = &local_558;
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_598
                 ,(value_type *)__x);
      iVar9 = this->m_gridSide;
    }
  }
  (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&positionBuf);
  (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8892,(ulong)positionBuf);
  (*ctx.super_Context._vptr_Context[0x28])(&ctx,0x8892,0x60,local_308,0x88e4);
  (*ctx.super_Context._vptr_Context[0x4e])(&ctx,(ulong)uVar3,4,0x1406,0,0,0);
  (*ctx.super_Context._vptr_Context[0x52])(&ctx,(ulong)uVar3,0);
  (*ctx.super_Context._vptr_Context[0x50])(&ctx,(ulong)uVar3);
  (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&offsetBuf);
  (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8892,(ulong)offsetBuf);
  (*ctx.super_Context._vptr_Context[0x28])
            (&ctx,0x8892,
             (long)offsets.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)offsets.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             offsets.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  (*ctx.super_Context._vptr_Context[0x4e])(&ctx,(ulong)uVar4,4,0x1406,0,0,0);
  (*ctx.super_Context._vptr_Context[0x52])(&ctx,(ulong)uVar4,1);
  (*ctx.super_Context._vptr_Context[0x50])(&ctx,(ulong)uVar4);
  (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&colorBuf);
  (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8892,(ulong)colorBuf);
  (*ctx.super_Context._vptr_Context[0x28])
            (&ctx,0x8892,(long)pVStack_590 - (long)local_598,local_598,0x88e4);
  (*ctx.super_Context._vptr_Context[0x4e])(&ctx,(ulong)uVar5,4,0x1406,0,0,0);
  (*ctx.super_Context._vptr_Context[0x52])(&ctx,(ulong)uVar5,1);
  (*ctx.super_Context._vptr_Context[0x50])(&ctx,(ulong)uVar5);
  if (this->m_useIndices == true) {
    (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&indexBuf);
    (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8893,(ulong)indexBuf);
    (*ctx.super_Context._vptr_Context[0x28])(&ctx,0x8893,0xc,indices,0x88e4);
  }
  (*ctx.super_Context._vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*ctx.super_Context._vptr_Context[0x2d])(&ctx,0x4000);
  (*ctx.super_Context._vptr_Context[5])
            (&ctx,0,0,(ulong)(uint)surface.m_width,(ulong)(uint)surface.m_height);
  (*ctx.super_Context._vptr_Context[0x76])(&ctx,(ulong)uVar2);
  if (this->m_useIndices == true) {
    (*ctx.super_Context._vptr_Context[0x6b])(&ctx,4,6,0x1403,0);
  }
  else {
    (*ctx.super_Context._vptr_Context[0x69])
              (&ctx,4,0,6,(ulong)(uint)(this->m_gridSide * this->m_gridSide));
  }
  (*ctx.super_Context._vptr_Context[0x76])(&ctx,0);
  if (this->m_useIndices == true) {
    (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&indexBuf);
  }
  (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&colorBuf);
  (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&offsetBuf);
  (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&positionBuf);
  (*ctx.super_Context._vptr_Context[0x77])(&ctx,(ulong)uVar2);
  (*ctx.super_Context._vptr_Context[0x7a])();
  (*ctx.super_Context._vptr_Context[0x80])
            (&ctx,&surface,0,0,(ulong)(uint)surface.m_width,(ulong)(uint)surface.m_height);
  err = (*ctx.super_Context._vptr_Context[0x79])();
  glu::checkError(err,glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDrawTests.cpp"
                  ,0x302);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             local_598);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&offsets.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::Surface((Surface *)&indexBuf,surface.m_width,surface.m_height);
  bVar1 = true;
  __n = 0;
  while (iVar9 = (int)__n, iVar9 < surface.m_height) {
    iVar8 = 0;
    while (iVar8 < surface.m_width) {
      if ((iVar9 == 0 || iVar8 == 0) ||
         (iVar8 + 1 == surface.m_width || iVar9 + 1U == surface.m_height)) {
        *(undefined4 *)((long)local_650 + (long)(int)(indexBuf * iVar9 + iVar8) * 4) = 0xff00ff00;
        iVar8 = iVar8 + 1;
      }
      else {
        uVar2 = *(uint *)((long)surface.m_pixels.m_ptr + (long)(surface.m_width * iVar9 + iVar8) * 4
                         );
        bVar13 = (~(uVar2 >> 8) & 0xff) < 0x15;
        bVar14 = (uVar2 & 0xff0000) < 0x140001;
        uVar12 = 0xff0000ff;
        if (bVar14 && bVar13) {
          uVar12 = 0xff00ff00;
        }
        *(undefined4 *)((long)local_650 + (long)(int)(indexBuf * iVar9 + iVar8) * 4) = uVar12;
        bVar1 = (bool)(bVar1 & (bVar14 && bVar13));
        iVar8 = iVar8 + 1;
      }
    }
    __n = (size_t)(iVar9 + 1U);
  }
  this_00 = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar9 = (int)this_00;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_598,"Verfication result",(allocator<char> *)&positionBuf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"Result of rendering",(allocator<char> *)&offsetBuf);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&offsets,(string *)local_598,&local_558.name);
    tcu::LogImageSet::write((LogImageSet *)&offsets,iVar9,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_618,"Result",(allocator<char> *)&colorBuf);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)indices,"Result",(allocator<char> *)local_528);
    pSVar10 = &surface;
    tcu::LogImage::LogImage
              ((LogImage *)local_308,(string *)local_618,(string *)indices,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_308,iVar9,__buf_00,(size_t)pSVar10);
    tcu::TestLog::endImageSet((TestLog *)this_00);
    tcu::LogImage::~LogImage((LogImage *)local_308);
    std::__cxx11::string::~string((string *)indices);
    std::__cxx11::string::~string((string *)local_618);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&offsets);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)local_598);
    description = "Pass";
  }
  else {
    local_308 = (undefined1  [8])this_00;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_300);
    std::operator<<((ostream *)&uStack_300,"Image verification failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_300);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"Verfication result",(allocator<char> *)local_528);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_618,"Result of rendering",(allocator<char> *)&local_530);
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_598,&local_558.name,(string *)local_618);
    tcu::LogImageSet::write((LogImageSet *)local_598,iVar9,__buf_01,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)indices,"Result",(allocator<char> *)&local_65c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&positionBuf,"Result",&local_697);
    pSVar10 = &surface;
    tcu::LogImage::LogImage
              ((LogImage *)local_308,(string *)indices,(string *)&positionBuf,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_308,iVar9,__buf_02,(size_t)pSVar10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&offsetBuf,"ErrorMask",&local_698);
    std::__cxx11::string::string<std::allocator<char>>((string *)&colorBuf,"Error mask",&local_699);
    pSVar10 = (Surface *)&indexBuf;
    tcu::LogImage::LogImage
              ((LogImage *)&offsets,(string *)&offsetBuf,(string *)&colorBuf,pSVar10,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&offsets,iVar9,__buf_03,(size_t)pSVar10);
    tcu::TestLog::endImageSet((TestLog *)this_00);
    tcu::LogImage::~LogImage((LogImage *)&offsets);
    std::__cxx11::string::~string((string *)&colorBuf);
    std::__cxx11::string::~string((string *)&offsetBuf);
    tcu::LogImage::~LogImage((LogImage *)local_308);
    std::__cxx11::string::~string((string *)&positionBuf);
    std::__cxx11::string::~string((string *)indices);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)local_598);
    std::__cxx11::string::~string((string *)local_618);
    std::__cxx11::string::~string((string *)&local_558);
    description = "Incorrect rendering result";
  }
  tcu::Surface::~Surface((Surface *)&indexBuf);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar1,
             description);
  sglr::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
  tcu::Surface::~Surface(&surface);
  sglr::GLContext::~GLContext(&ctx);
  return STOP;
}

Assistant:

InstancedGridRenderTest::IterateResult InstancedGridRenderTest::iterate (void)
{
	const int renderTargetWidth  = de::min(1024, m_context.getRenderTarget().getWidth());
	const int renderTargetHeight = de::min(1024, m_context.getRenderTarget().getHeight());

	sglr::GLContext ctx		(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));
	tcu::Surface	surface	(renderTargetWidth, renderTargetHeight);
	GridProgram		program;

	// render

	renderTo(ctx, program, surface);

	// verify image

	if (verifyImage(surface))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rendering result");
	return STOP;
}